

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int CBS_get_asn1_int64_with_tag(CBS *cbs,int64_t *out,CBS_ASN1_TAG tag)

{
  int iVar1;
  int iVar2;
  int is_negative;
  uint8_t sign_extend [8];
  CBS bytes;
  int local_2c;
  ulong local_28;
  CBS local_20;
  
  iVar1 = cbs_get_asn1(cbs,&local_20,tag,1);
  iVar2 = 0;
  if (iVar1 != 0) {
    iVar1 = CBS_is_valid_asn1_integer(&local_20,&local_2c);
    iVar2 = 0;
    if ((iVar1 != 0) && (local_20.len < 9)) {
      local_28 = (ulong)(-(uint)(local_2c != 0) & 0xff) * 0x101010101010101;
      if (local_20.len != 0) {
        memcpy((void *)((long)&local_20 - local_20.len),local_20.data,local_20.len);
      }
      *out = local_28 >> 0x38 | (local_28 & 0xff000000000000) >> 0x28 |
             (local_28 & 0xff0000000000) >> 0x18 | (local_28 & 0xff00000000) >> 8 |
             (local_28 & 0xff000000) << 8 | (local_28 & 0xff0000) << 0x18 |
             (local_28 & 0xff00) << 0x28 | local_28 << 0x38;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int CBS_get_asn1_int64_with_tag(CBS *cbs, int64_t *out, CBS_ASN1_TAG tag) {
  int is_negative;
  CBS bytes;
  if (!CBS_get_asn1(cbs, &bytes, tag) ||
      !CBS_is_valid_asn1_integer(&bytes, &is_negative)) {
    return 0;
  }
  const uint8_t *data = CBS_data(&bytes);
  const size_t len = CBS_len(&bytes);
  if (len > sizeof(int64_t)) {
    return 0;
  }
  uint8_t sign_extend[sizeof(int64_t)];
  OPENSSL_memset(sign_extend, is_negative ? 0xff : 0, sizeof(sign_extend));
  OPENSSL_memcpy(sign_extend + sizeof(int64_t) - len, data, len);
  *out = CRYPTO_load_u64_be(sign_extend);
  return 1;
}